

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputparser.cpp
# Opt level: O3

void __thiscall PropertyParser::parseReactProperty(PropertyParser *this,string *reactType)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  int type;
  undefined1 local_70 [8];
  string name;
  
  pbVar1 = (this->tokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  local_70 = (undefined1  [8])&name._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  name.field_2._8_8_ = &stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&name.field_2 + 8),"BULK","");
  bVar3 = Utilities::match(reactType,(string *)((long)&name.field_2 + 8));
  if ((undefined1 *)name.field_2._8_8_ != &stack0xffffffffffffffc0) {
    operator_delete((void *)name.field_2._8_8_);
  }
  type = 3;
  if (!bVar3) {
    name.field_2._8_8_ = &stack0xffffffffffffffc0;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&name.field_2 + 8),"WALL","");
    bVar3 = Utilities::match(reactType,(string *)((long)&name.field_2 + 8));
    if ((undefined1 *)name.field_2._8_8_ != &stack0xffffffffffffffc0) {
      operator_delete((void *)name.field_2._8_8_);
    }
    type = 4;
    if (!bVar3) {
      name.field_2._8_8_ = &stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char_const*>((string *)((long)&name.field_2 + 8),"TANK","")
      ;
      bVar3 = Utilities::match(reactType,(string *)((long)&name.field_2 + 8));
      if ((undefined1 *)name.field_2._8_8_ != &stack0xffffffffffffffc0) {
        operator_delete((void *)name.field_2._8_8_);
      }
      if (bVar3) {
        parseNodeProperty(this,0x13,(string *)local_70);
      }
      else {
        OptionParser::parseReactOption
                  (&this->optionParser,(this->super_InputParser).network,&this->tokens);
      }
      goto LAB_00132ba0;
    }
  }
  parseLinkProperty(this,type,(string *)local_70);
LAB_00132ba0:
  if (local_70 != (undefined1  [8])&name._M_string_length) {
    operator_delete((void *)local_70);
  }
  return;
}

Assistant:

void PropertyParser::parseReactProperty(string& reactType)
{
    string name = tokens[1];
    if ( Utilities::match(reactType, w_Bulk) )
    {
        parseLinkProperty(BULK, name);
    }
    else if ( Utilities::match(reactType, w_Wall) )
    {
        parseLinkProperty(WALL, name);
    }
    else if ( Utilities::match(reactType, w_Tank) )
    {
        parseNodeProperty(InputReader::REACTION, name);
    }
    else optionParser.parseReactOption(network, tokens);
}